

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReportSection.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Element *pEVar1;
  undefined8 uVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  PreviewDialog local_4b0 [8];
  PreviewDialog preview;
  QLatin1String local_480;
  QString local_470;
  QArrayDataPointer<char16_t> local_458;
  QString local_440;
  undefined1 local_428 [8];
  QString tocText;
  QString local_3f8;
  QArrayDataPointer<char16_t> local_3e0;
  QString local_3c8;
  QArrayDataPointer<char16_t> local_3b0;
  QString local_398;
  undefined1 local_380 [8];
  QStringList tocList;
  QLatin1String local_350;
  QString local_340;
  QColor local_328;
  TableElement local_318 [8];
  TableElement largeTableElement;
  QList<QTextOption::Tab> local_2f8;
  QColor local_2e0;
  QLatin1String local_2d0;
  QString local_2c0;
  QString local_2a8;
  undefined1 local_290 [8];
  TextElement tocElement;
  undefined6 local_278;
  undefined2 uStack_272;
  undefined6 local_270;
  undefined6 local_268;
  undefined2 local_262;
  undefined6 uStack_260;
  undefined1 local_258 [8];
  QList<QTextOption::Tab> tabs;
  QString local_230;
  QString local_218;
  undefined1 local_200 [8];
  TextElement pageCountElement;
  QString local_1e8;
  TextElement local_1d0 [24];
  QString local_1b8;
  TextElement local_1a0 [24];
  QString local_188;
  TextElement local_170 [24];
  QString local_158;
  TextElement local_140 [28];
  QFlags<KDReports::HeaderLocation> local_124;
  Element *local_120;
  Footer *footer;
  TextElement local_100 [28];
  QFlags<KDReports::HeaderLocation> local_e4;
  Element *local_e0;
  Header *header;
  QFont local_c0 [32];
  undefined1 local_a0 [8];
  Report report;
  QApplication local_88 [8];
  QApplication app;
  char **argv_local;
  int argc_local;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_58;
  char16_t *local_50;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_40;
  char16_t *local_38;
  char16_t *str_2;
  qsizetype *local_28;
  char16_t *local_20;
  char16_t *str_3;
  QArrayDataPointer<char16_t> *local_10;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  QApplication::QApplication(local_88,(int *)&argv_local,argv,0x60204);
  KDReports::Report::Report((Report *)local_a0,(QObject *)0x0);
  QString::QString((QString *)&header,"Arial");
  QFont::QFont(local_c0,(QString *)&header,8,-1,false);
  KDReports::Report::setDefaultFont((QFont *)local_a0);
  QFont::~QFont(local_c0);
  QString::~QString((QString *)&header);
  KDReports::Report::setFirstPageNumber((int)local_a0);
  QFlags<KDReports::HeaderLocation>::QFlags(&local_e4,FirstPage);
  pEVar1 = (Element *)KDReports::Report::header((QFlags_conflict *)local_a0);
  local_e0 = pEVar1;
  QString::QString((QString *)&footer,
                   "This is a test for generating one section of a larger report.");
  KDReports::TextElement::TextElement(local_100,(QString *)&footer);
  KDReports::Header::addElement(pEVar1,(AlignmentFlag)local_100);
  KDReports::TextElement::~TextElement(local_100);
  QString::~QString((QString *)&footer);
  QFlags<KDReports::HeaderLocation>::QFlags(&local_124,AllPages);
  pEVar1 = (Element *)KDReports::Report::footer((QFlags_conflict *)local_a0);
  local_120 = pEVar1;
  QString::QString(&local_158,"We are generating pages 100-109 out of 500.");
  KDReports::TextElement::TextElement(local_140,&local_158);
  KDReports::Header::addElement(pEVar1,(AlignmentFlag)local_140);
  KDReports::TextElement::~TextElement(local_140);
  QString::~QString(&local_158);
  pEVar1 = local_120;
  QString::QString(&local_188,"Page");
  KDReports::TextElement::TextElement(local_170,&local_188);
  KDReports::Header::addElement(pEVar1,(AlignmentFlag)local_170);
  KDReports::TextElement::~TextElement(local_170);
  QString::~QString(&local_188);
  pEVar1 = local_120;
  QString::QString(&local_1b8," ");
  KDReports::TextElement::TextElement(local_1a0,&local_1b8);
  KDReports::Header::addInlineElement(pEVar1);
  KDReports::TextElement::~TextElement(local_1a0);
  QString::~QString(&local_1b8);
  KDReports::Header::addVariable((VariableType)local_120);
  pEVar1 = local_120;
  QString::QString(&local_1e8," / ");
  KDReports::TextElement::TextElement(local_1d0,&local_1e8);
  KDReports::Header::addInlineElement(pEVar1);
  KDReports::TextElement::~TextElement(local_1d0);
  QString::~QString(&local_1e8);
  QString::QString(&local_218);
  KDReports::TextElement::TextElement((TextElement *)local_200,&local_218);
  QString::~QString(&local_218);
  QLatin1String::QLatin1String((QLatin1String *)&tabs.d.size,"id_page_count");
  QString::QString(&local_230,stack0xfffffffffffffdc0);
  KDReports::TextElement::setId((QString *)local_200);
  QString::~QString(&local_230);
  KDReports::Header::addInlineElement(local_120);
  QList<QTextOption::Tab>::QList((QList<QTextOption::Tab> *)local_258);
  uVar2 = KDReports::Report::rightAlignedTab();
  local_278 = (undefined6)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  uStack_272 = (undefined2)((uint)extraout_XMM0_Db >> 0x10);
  local_270 = (undefined6)uVar2;
  uStack_260 = local_270;
  local_268 = local_278;
  local_262 = uStack_272;
  QList<QTextOption::Tab>::append((QList<QTextOption::Tab> *)local_258,(rvalue_ref)&local_268);
  KDReports::Report::setTabPositions((QList *)local_a0);
  QString::QString(&local_2a8,"<Table of Contents will go here>");
  KDReports::TextElement::TextElement((TextElement *)local_290,&local_2a8);
  QString::~QString(&local_2a8);
  QLatin1String::QLatin1String(&local_2d0,"id_toc");
  QString::QString(&local_2c0,local_2d0);
  KDReports::TextElement::setId((QString *)local_290);
  QString::~QString(&local_2c0);
  QColor::QColor(&local_2e0);
  KDReports::Report::addElement((Element *)local_a0,(AlignmentFlag)local_290,(QColor *)0x1);
  KDReports::Report::addVerticalSpacing(10.0);
  local_2f8.d.d = (Data *)0x0;
  local_2f8.d.ptr = (Tab *)0x0;
  local_2f8.d.size = 0;
  QList<QTextOption::Tab>::QList(&local_2f8);
  KDReports::Report::setTabPositions((QList *)local_a0);
  QList<QTextOption::Tab>::~QList(&local_2f8);
  largeTable();
  QColor::QColor(&local_328);
  KDReports::Report::addElement((Element *)local_a0,(AlignmentFlag)local_318,(QColor *)0x1);
  QLatin1String::QLatin1String(&local_350,"id_page_count");
  QString::QString(&local_340,local_350);
  QString::number((int)&tocList + 0x10,500);
  KDReports::Report::associateTextValue((QString *)local_a0,&local_340);
  QString::~QString((QString *)&tocList.d.size);
  QString::~QString(&local_340);
  QList<QString>::QList((QList<QString> *)local_380);
  local_40 = &local_3b0;
  str = L"Chapter one\tpage 1";
  local_50 = L"Chapter one\tpage 1";
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3b0,(Data *)0x0,L"Chapter one\tpage 1",0x12)
  ;
  QString::QString(&local_398,&local_3b0);
  QList<QString>::operator<<((QList<QString> *)local_380,&local_398);
  QString::~QString(&local_398);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3b0);
  local_58 = &local_3e0;
  str_1 = L"Chapter two\tpage 3";
  _argc_local = L"Chapter two\tpage 3";
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3e0,(Data *)0x0,L"Chapter two\tpage 3",0x12)
  ;
  QString::QString(&local_3c8,&local_3e0);
  QList<QString>::operator<<((QList<QString> *)local_380,&local_3c8);
  QString::~QString(&local_3c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3e0);
  local_28 = &tocText.d.size;
  str_2 = L"Last chapter\tpage 6";
  local_38 = L"Last chapter\tpage 6";
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&tocText.d.size,(Data *)0x0,L"Last chapter\tpage 6",0x13
            );
  QString::QString(&local_3f8,(DataPointer *)&tocText.d.size);
  QList<QString>::operator<<((QList<QString> *)local_380,&local_3f8);
  QString::~QString(&local_3f8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tocText.d.size);
  local_10 = &local_458;
  str_3 = L"\n";
  local_20 = L"\n";
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_458,(Data *)0x0,L"\n",1);
  QString::QString(&local_440,&local_458);
  QListSpecialMethods<QString>::join
            ((QString *)local_428,(QListSpecialMethods<QString> *)local_380,&local_440);
  QString::~QString(&local_440);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_458);
  QLatin1String::QLatin1String(&local_480,"id_toc");
  QString::QString(&local_470,local_480);
  KDReports::Report::associateTextValue((QString *)local_a0,&local_470);
  QString::~QString(&local_470);
  KDReports::PreviewDialog::PreviewDialog(local_4b0,(Report *)local_a0,(QWidget *)0x0);
  argv_local._4_4_ = QDialog::exec();
  KDReports::PreviewDialog::~PreviewDialog(local_4b0);
  QString::~QString((QString *)local_428);
  QList<QString>::~QList((QList<QString> *)local_380);
  KDReports::TableElement::~TableElement(local_318);
  KDReports::TextElement::~TextElement((TextElement *)local_290);
  QList<QTextOption::Tab>::~QList((QList<QTextOption::Tab> *)local_258);
  KDReports::TextElement::~TextElement((TextElement *)local_200);
  KDReports::Report::~Report((Report *)local_a0);
  QApplication::~QApplication(local_88);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    QApplication app(argc, argv);

    KDReports::Report report;
    report.setDefaultFont(QFont("Arial", 8));

    report.setFirstPageNumber(100);

    KDReports::Header &header = report.header(KDReports::FirstPage);
    header.addElement(KDReports::TextElement("This is a test for generating one section of a larger report."));

    KDReports::Footer &footer = report.footer();
    footer.addElement(KDReports::TextElement("We are generating pages 100-109 out of 500."));
    footer.addElement(KDReports::TextElement("Page"), Qt::AlignRight);
    footer.addInlineElement(KDReports::TextElement(" "));
    footer.addVariable(KDReports::PageNumber);
    footer.addInlineElement(KDReports::TextElement(" / "));
    // As an example for combining reports together, we'll set the value of
    // the total page count later, when it's known.
    KDReports::TextElement pageCountElement;
    pageCountElement.setId(QLatin1String("id_page_count"));
    footer.addInlineElement(pageCountElement);

    QList<QTextOption::Tab> tabs;
    tabs.append(KDReports::Report::rightAlignedTab());
    report.setTabPositions(tabs);

    KDReports::TextElement tocElement("<Table of Contents will go here>");
    tocElement.setId(QLatin1String("id_toc"));
    report.addElement(tocElement);

    report.addVerticalSpacing(10);

    report.setTabPositions(QList<QTextOption::Tab>()); // for performance

    KDReports::TableElement largeTableElement = largeTable();
    report.addElement(largeTableElement);

    // Let's assume we know the total page count is 1000 now, let's set it.
    report.associateTextValue(QLatin1String("id_page_count"), QString::number(500));

    // Fill in the table of contents
    QStringList tocList;
    tocList << QStringLiteral("Chapter one\tpage 1");
    tocList << QStringLiteral("Chapter two\tpage 3");
    tocList << QStringLiteral("Last chapter\tpage 6");
    QString tocText = tocList.join(QStringLiteral("\n"));
    report.associateTextValue(QLatin1String("id_toc"), tocText);

    KDReports::PreviewDialog preview(&report);
    return preview.exec();

    // For performance testing...
    // report.exportToFile( "testout.pdf" );
    // return 0;
}